

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O3

bool __thiscall
cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking
          (cmLinkLineDeviceComputer *this,cmComputeLinkInformation *cli)

{
  pointer pcVar1;
  pointer pIVar2;
  cmGeneratorTarget *pcVar3;
  bool bVar4;
  TargetType TVar5;
  ItemVector *pIVar6;
  pointer pIVar7;
  string config;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  pIVar6 = cmComputeLinkInformation::GetItems(cli);
  local_70[0] = local_60;
  pcVar1 = (cli->Config)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar1,pcVar1 + (cli->Config)._M_string_length);
  pIVar7 = (pIVar6->
           super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pIVar2 = (pIVar6->
           super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar7 != pIVar2) {
    do {
      if (pIVar7->Target != (cmGeneratorTarget *)0x0) {
        TVar5 = cmGeneratorTarget::GetType(pIVar7->Target);
        if (TVar5 == STATIC_LIBRARY) {
          pcVar3 = pIVar7->Target;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"CUDA_RESOLVE_DEVICE_SYMBOLS","");
          bVar4 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,&local_50);
          if (bVar4) {
            bVar4 = false;
          }
          else {
            pcVar3 = pIVar7->Target;
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_90,"CUDA_SEPARABLE_COMPILATION","");
            bVar4 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,&local_90);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (bVar4 != false) {
            bVar4 = true;
            goto LAB_00372406;
          }
        }
      }
      pIVar7 = pIVar7 + 1;
    } while (pIVar7 != pIVar2);
  }
  bVar4 = false;
LAB_00372406:
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return bVar4;
}

Assistant:

bool cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(
  cmComputeLinkInformation& cli)
{
  // Determine if this item might requires device linking.
  // For this we only consider targets
  typedef cmComputeLinkInformation::ItemVector ItemVector;
  ItemVector const& items = cli.GetItems();
  std::string config = cli.GetConfig();
  for (auto const& item : items) {
    if (item.Target &&
        item.Target->GetType() == cmStateEnums::STATIC_LIBRARY) {
      if ((!item.Target->GetPropertyAsBool("CUDA_RESOLVE_DEVICE_SYMBOLS")) &&
          item.Target->GetPropertyAsBool("CUDA_SEPARABLE_COMPILATION")) {
        // this dependency requires us to device link it
        return true;
      }
    }
  }
  return false;
}